

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_loopfilter.c
# Opt level: O2

uint8_t get_filter_level(AV1_COMMON *cm,loop_filter_info_n *lfi_n,int dir_idx,int plane,
                        MB_MODE_INFO *mbmi)

{
  uint8_t uVar1;
  uint uVar2;
  ulong uVar3;
  int8_t *piVar4;
  int *piVar5;
  ulong uVar6;
  uint8_t uVar7;
  int iVar8;
  byte bVar9;
  uint uVar10;
  
  bVar9 = mbmi->field_0xa7 & 7;
  if ((cm->delta_q_info).delta_lf_present_flag == 0) {
    uVar3 = (ulong)lfi_n->lvl[plane][bVar9][(uint)dir_idx][mbmi->ref_frame[0]]
                   [mode_lf_lut[mbmi->mode]];
  }
  else {
    if ((cm->delta_q_info).delta_lf_multi == 0) {
      piVar4 = &mbmi->delta_lf_from_base;
    }
    else {
      piVar4 = mbmi->delta_lf + delta_lf_id_lut[plane][(uint)dir_idx];
    }
    if (plane == 1) {
      piVar5 = &(cm->lf).filter_level_u;
    }
    else if (plane == 0) {
      piVar5 = (cm->lf).filter_level + (uint)dir_idx;
    }
    else {
      piVar5 = &(cm->lf).filter_level_v;
    }
    uVar10 = (int)*piVar4 + *piVar5;
    uVar6 = 0x3f;
    if (uVar10 < 0x3f) {
      uVar6 = (ulong)uVar10;
    }
    uVar3 = 0;
    if (-1 < (int)uVar10) {
      uVar3 = uVar6;
    }
    if (((cm->seg).enabled != '\0') &&
       (((cm->seg).feature_mask[bVar9] >> (seg_lvl_lf_lut[plane][(uint)dir_idx] & 0x1f) & 1) != 0))
    {
      uVar2 = (int)uVar3 +
              (int)(cm->seg).feature_data[bVar9][(uint)seg_lvl_lf_lut[plane][(uint)dir_idx]];
      uVar10 = 0x3f;
      if (uVar2 < 0x3f) {
        uVar10 = uVar2;
      }
      uVar3 = 0;
      if (-1 < (int)uVar2) {
        uVar3 = (ulong)uVar10;
      }
    }
    if ((cm->lf).mode_ref_delta_enabled != '\0') {
      iVar8 = (int)(cm->lf).ref_deltas[mbmi->ref_frame[0]];
      if (0 < (long)mbmi->ref_frame[0]) {
        iVar8 = iVar8 + (cm->lf).mode_deltas[mode_lf_lut[mbmi->mode]];
      }
      uVar10 = (iVar8 << ((byte)(uVar3 >> 5) & 0x1f)) + (int)uVar3;
      uVar7 = '?';
      if (uVar10 < 0x3f) {
        uVar7 = (uint8_t)uVar10;
      }
      uVar1 = '\0';
      if (-1 < (int)uVar10) {
        uVar1 = uVar7;
      }
      return uVar1;
    }
  }
  return (uint8_t)uVar3;
}

Assistant:

static uint8_t get_filter_level(const AV1_COMMON *cm,
                                const loop_filter_info_n *lfi_n,
                                const int dir_idx, int plane,
                                const MB_MODE_INFO *mbmi) {
  const int segment_id = mbmi->segment_id;
  if (cm->delta_q_info.delta_lf_present_flag) {
    int8_t delta_lf;
    if (cm->delta_q_info.delta_lf_multi) {
      const int delta_lf_idx = delta_lf_id_lut[plane][dir_idx];
      delta_lf = mbmi->delta_lf[delta_lf_idx];
    } else {
      delta_lf = mbmi->delta_lf_from_base;
    }
    int base_level;
    if (plane == 0)
      base_level = cm->lf.filter_level[dir_idx];
    else if (plane == 1)
      base_level = cm->lf.filter_level_u;
    else
      base_level = cm->lf.filter_level_v;
    int lvl_seg = clamp(delta_lf + base_level, 0, MAX_LOOP_FILTER);
    assert(plane >= 0 && plane <= 2);
    const int seg_lf_feature_id = seg_lvl_lf_lut[plane][dir_idx];
    if (segfeature_active(&cm->seg, segment_id, seg_lf_feature_id)) {
      const int data = get_segdata(&cm->seg, segment_id, seg_lf_feature_id);
      lvl_seg = clamp(lvl_seg + data, 0, MAX_LOOP_FILTER);
    }

    if (cm->lf.mode_ref_delta_enabled) {
      const int scale = 1 << (lvl_seg >> 5);
      lvl_seg += cm->lf.ref_deltas[mbmi->ref_frame[0]] * scale;
      if (mbmi->ref_frame[0] > INTRA_FRAME)
        lvl_seg += cm->lf.mode_deltas[mode_lf_lut[mbmi->mode]] * scale;
      lvl_seg = clamp(lvl_seg, 0, MAX_LOOP_FILTER);
    }
    return lvl_seg;
  } else {
    return lfi_n->lvl[plane][segment_id][dir_idx][mbmi->ref_frame[0]]
                     [mode_lf_lut[mbmi->mode]];
  }
}